

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

bool test_queue(void)

{
  char cVar1;
  int iVar2;
  long *plVar3;
  int in_ECX;
  nfds_t __nfds;
  nfds_t __nfds_00;
  nfds_t __nfds_01;
  nfds_t __nfds_02;
  pollfd *ppVar4;
  ArrayQueue queue;
  ArrayQueue local_20;
  
  si9ma::ArrayQueue::ArrayQueue(&local_20,3);
  si9ma::ArrayQueue::push(&local_20,100);
  ppVar4 = (pollfd *)0x1e;
  si9ma::ArrayQueue::push(&local_20,0x1e);
  iVar2 = si9ma::ArrayQueue::poll(&local_20,ppVar4,__nfds,in_ECX);
  plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
  cVar1 = std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  ppVar4 = (pollfd *)(ulong)(uint)(int)cVar1;
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  iVar2 = si9ma::ArrayQueue::poll(&local_20,ppVar4,__nfds_00,in_ECX);
  plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  si9ma::ArrayQueue::push(&local_20,0x32);
  si9ma::ArrayQueue::push(&local_20,0x50);
  si9ma::ArrayQueue::push(&local_20,0x50);
  si9ma::ArrayQueue::push(&local_20,0x50);
  ppVar4 = (pollfd *)0x50;
  si9ma::ArrayQueue::push(&local_20,0x50);
  iVar2 = si9ma::ArrayQueue::poll(&local_20,ppVar4,__nfds_01,in_ECX);
  plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
  cVar1 = std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  ppVar4 = (pollfd *)(ulong)(uint)(int)cVar1;
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  iVar2 = si9ma::ArrayQueue::poll(&local_20,ppVar4,__nfds_02,in_ECX);
  plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  si9ma::ArrayQueue::~ArrayQueue(&local_20);
  return true;
}

Assistant:

bool test_queue(){
    ArrayQueue queue(3);
    try {
        queue.push(100);
        queue.push(30);
        cout << queue.poll() << endl;
        cout << queue.poll() << endl;
        queue.push(50);
        queue.push(80);
        queue.push(80);
        queue.push(80);
        queue.push(80);
        cout << queue.poll() << endl;
        cout << queue.poll() << endl;
        return true;
    }catch (char const* str){
        cout << str << endl;
        return false;
    }
}